

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_base.cpp
# Opt level: O3

ConverterBase * __thiscall Gray16::ConverterBase::convert(ConverterBase *this,QImage *originalImage)

{
  QDebug this_00;
  int iVar1;
  uint uVar2;
  QImage *in_RDX;
  QByteArrayView QVar3;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QString local_50;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  iVar1 = QImage::format();
  if (iVar1 == 0x1c) {
    (**(code **)(*(long *)originalImage + 0x18))(this,originalImage);
  }
  else {
    local_38 = 2;
    local_34 = 0;
    uStack_2c = 0;
    local_24 = 0;
    local_20 = "default";
    QMessageLogger::critical();
    this_00.stream = local_68.stream;
    QVar3.m_data = (storage_type *)0x24;
    QVar3.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    *(int *)((QTextStream *)local_68.stream + 0x28) =
         *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
    uVar2 = QImage::format();
    qt_QMetaEnum_debugOperator
              (&local_58,(longlong)&local_60,(QMetaObject *)(ulong)uVar2,
               (char *)&QImage::staticMetaObject);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    QImage::QImage((QImage *)this,in_RDX);
  }
  return this;
}

Assistant:

QImage ConverterBase::convert(const QImage &originalImage) const {
  if(originalImage.format() != QImage::Format_Grayscale16) {
    qCritical() << "Source image not Format_grayscale16:" << originalImage.format();

    return originalImage;
  }

  return mConvert(originalImage);
}